

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_print(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  bool *pbVar2;
  TextOutputMethod *pp_Var3;
  _func_int **pp_Var4;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *pHVar5;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar6;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar7;
  bool bVar8;
  ListStorage<MiniScript::Context_*> *pLVar9;
  undefined2 *puVar10;
  Machine *pMVar11;
  Interpreter *pIVar12;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar13;
  TextOutputMethod __s;
  HashMapEntry<MiniScript::Value,_MiniScript::Value> *__n;
  undefined1 *__n_00;
  anon_union_8_3_2f476f46_for_data aVar14;
  String SVar15;
  Value delimiter;
  Value s;
  undefined1 local_d8 [8];
  anon_union_8_3_2f476f46_for_data local_d0;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_c8;
  bool local_c0;
  Value local_b8;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_a8;
  anon_union_8_3_2f476f46_for_data local_a0;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_98;
  anon_union_8_3_2f476f46_for_data local_90;
  _func_int **local_88;
  anon_union_8_3_2f476f46_for_data local_80;
  long *local_78;
  anon_union_8_3_2f476f46_for_data local_70;
  Machine *local_68;
  anon_union_8_3_2f476f46_for_data local_60;
  ListStorage<MiniScript::Context_*> *local_58;
  anon_union_8_3_2f476f46_for_data local_50;
  Machine *local_48;
  anon_union_8_3_2f476f46_for_data local_40;
  Context *local_38;
  
  local_50.tempNum._0_1_ = false;
  pLVar9 = (ListStorage<MiniScript::Context_*> *)operator_new(0x30);
  (pLVar9->super_RefCountedStorage).refCount = 1;
  (pLVar9->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001d10b0;
  (pLVar9->super_SimpleVector<MiniScript::Context_*>).mBuf = (Context **)0x2;
  (pLVar9->super_SimpleVector<MiniScript::Context_*>).mQtyItems = 0xffffffffffffffff;
  puVar10 = (undefined2 *)operator_new__(2);
  (pLVar9->super_SimpleVector<MiniScript::Context_*>).mBlockItems = (unsigned_long)puVar10;
  *puVar10 = 0;
  *puVar10 = 0x73;
  local_58 = pLVar9;
  Context::GetVar((Context *)&local_b8,(String *)partialResult.rs,(LocalOnlyMode)&local_58);
  if ((local_58 != (ListStorage<MiniScript::Context_*> *)0x0) &&
     ((bool)local_50.tempNum._0_1_ == false)) {
    plVar1 = &(local_58->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_58->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_58 = (ListStorage<MiniScript::Context_*> *)0x0;
  }
  if (local_b8.type == Null) {
    Value::Value((Value *)local_d8,"null");
    Value::operator=(&local_b8,(Value *)local_d8);
    if ((Temp < local_d8[0]) && (local_d0.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_d0.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_d0.ref)->_vptr_RefCountedStorage[1])();
      }
      local_d0.number = 0.0;
    }
  }
  local_60.tempNum._0_1_ = '\0';
  pMVar11 = (Machine *)operator_new(0x30);
  *(undefined8 *)&pMVar11->storeImplicit = 1;
  pMVar11->standardOutput = (TextOutputMethod)&PTR__StringStorage_001d10b0;
  *(undefined8 *)&pMVar11->yielding = 10;
  (pMVar11->functionType).type = ~Null;
  (pMVar11->functionType).noInvoke = true;
  (pMVar11->functionType).localOnly = ~Off;
  *(undefined5 *)&(pMVar11->functionType).field_0x3 = 0xffffffffff;
  pIVar12 = (Interpreter *)operator_new__(10);
  pMVar11->interpreter = pIVar12;
  pIVar12->_vptr_Interpreter = (_func_int **)0x6574696d696c6564;
  *(undefined2 *)&pIVar12->standardOutput = 0x72;
  local_68 = pMVar11;
  Context::GetVar((Context *)local_d8,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  if ((local_68 != (Machine *)0x0) && (local_60.tempNum._0_1_ == '\0')) {
    pbVar2 = &local_68->storeImplicit;
    *(long *)pbVar2 = *(long *)pbVar2 + -1;
    if (*(long *)pbVar2 == 0) {
      (**(code **)(local_68->standardOutput + 8))();
    }
    local_68 = (Machine *)0x0;
  }
  if (local_d8[0] == Null) {
    pp_Var4 = (partialResult.rs[2].result.data.ref)->_vptr_RefCountedStorage;
    SVar15 = Value::ToString((Value *)&local_78,(Machine *)&local_b8);
    (*(code *)pp_Var4)(&local_78,0,SVar15._8_8_);
    if ((local_78 != (long *)0x0) && (local_70.tempNum._0_1_ == '\0')) {
      plVar1 = local_78 + 1;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (**(code **)(*local_78 + 8))();
      }
      local_78 = (long *)0x0;
    }
  }
  else {
    bVar8 = Value::operator==((Value *)local_d8,(Value *)&_EOL);
    aVar14.number = *partialResult.rs[2].result.data;
    if (bVar8) {
      SVar15 = Value::ToString((Value *)&local_88,(Machine *)&local_b8);
      (*(code *)aVar14)(&local_88,1,SVar15._8_8_);
      if ((local_88 != (_func_int **)0x0) && (local_80.tempNum._0_1_ == '\0')) {
        pp_Var4 = local_88 + 1;
        *pp_Var4 = *pp_Var4 + -1;
        if (*pp_Var4 == (_func_int *)0x0) {
          (**(code **)(*local_88 + 8))();
        }
        local_88 = (_func_int **)0x0;
      }
    }
    else {
      Value::ToString((Value *)&local_a8,(Machine *)&local_b8);
      Value::ToString((Value *)&local_98,(Machine *)local_d8);
      pDVar7 = local_98;
      pDVar6 = local_a8;
      if (local_98 == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
        local_c8 = local_a8;
        if (local_a8 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
          pp_Var3 = (TextOutputMethod *)&(local_a8->super_RefCountedStorage).refCount;
          *pp_Var3 = *pp_Var3 + 1;
        }
      }
      else if (local_a8 == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
        local_c8 = local_98;
        pp_Var3 = (TextOutputMethod *)&(local_98->super_RefCountedStorage).refCount;
        *pp_Var3 = *pp_Var3 + 1;
      }
      else {
        pHVar5 = local_a8->mTable[0];
        pMVar11 = (Machine *)local_98->mTable[0];
        local_40 = aVar14;
        local_38 = context;
        pDVar13 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
        __n = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)
              ((undefined1 *)((long)&pMVar11[-1].startTime + 7) + (long)&pHVar5->next);
        (pDVar13->super_RefCountedStorage).refCount = 1;
        (pDVar13->super_RefCountedStorage)._vptr_RefCountedStorage =
             (_func_int **)&PTR__StringStorage_001d10b0;
        pDVar13->mTable[0] = __n;
        pDVar13->mTable[1] =
             (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
        local_48 = pMVar11;
        __s = (TextOutputMethod)operator_new__((ulong)__n);
        __n_00 = (undefined1 *)((long)&pHVar5[-1].value.data + 7);
        pDVar13->mSize = (long)__s;
        memset(__s,0,(size_t)__n);
        memcpy(__s,(TextOutputMethod)pDVar6->mSize,(size_t)__n_00);
        memcpy(__n_00 + (long)__s,(TextOutputMethod)pDVar7->mSize,(size_t)local_48);
        context = local_38;
        aVar14 = local_40;
        local_c8 = pDVar13;
      }
      local_c0 = false;
      (*(code *)aVar14)(&local_c8,0);
      if ((local_c8 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
         (local_c0 == false)) {
        pp_Var3 = (TextOutputMethod *)&(local_c8->super_RefCountedStorage).refCount;
        *pp_Var3 = *pp_Var3 + -1;
        if (*pp_Var3 == (TextOutputMethod)0x0) {
          (*(local_c8->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_c8 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      }
      if ((local_98 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
         (local_90.tempNum._0_1_ == '\0')) {
        pp_Var3 = (TextOutputMethod *)&(local_98->super_RefCountedStorage).refCount;
        *pp_Var3 = *pp_Var3 + -1;
        if (*pp_Var3 == (TextOutputMethod)0x0) {
          (*(local_98->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_98 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      }
      if ((local_a8 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
         (local_a0.tempNum._0_1_ == '\0')) {
        pp_Var3 = (TextOutputMethod *)&(local_a8->super_RefCountedStorage).refCount;
        *pp_Var3 = *pp_Var3 + -1;
        if (*pp_Var3 == (TextOutputMethod)0x0) {
          (*(local_a8->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_a8 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      }
    }
  }
  IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
  pp_Var4 = IntrinsicResult::Null;
  ((RefCountedStorage *)&context->code)->_vptr_RefCountedStorage = IntrinsicResult::Null;
  if (pp_Var4 != (_func_int **)0x0) {
    pp_Var4 = pp_Var4 + 1;
    *pp_Var4 = *pp_Var4 + 1;
  }
  if ((Temp < local_d8[0]) && (local_d0.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_d0.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_d0.ref)->_vptr_RefCountedStorage[1])();
    }
    local_d0.number = 0.0;
  }
  if ((Temp < local_b8.type) && (local_b8.data.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_b8.data.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_b8.data.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_print(Context *context, IntrinsicResult partialResult) {
		Value s = context->GetVar("s");
		if (s.IsNull()) s = "null";
		Value delimiter = context->GetVar("delimiter");
		if (delimiter.IsNull()) {
			(*context->vm->standardOutput)(s.ToString(), false);
		} else if (delimiter == _EOL) {
			(*context->vm->standardOutput)(s.ToString(), true);
		} else {
			(*context->vm->standardOutput)(s.ToString() + delimiter.ToString(), false);
		}
		return IntrinsicResult::Null;
	}